

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O1

void Qiniu_Rio_doTask(void *params)

{
  ulong uVar1;
  uint blkIdx;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long *plVar5;
  _Qiniu_Uploading_Parts_Progress *progress;
  _func_void_size_t_size_t *p_Var6;
  long lVar7;
  Qiniu_Writer w;
  Qiniu_Writer w_00;
  size_t sVar8;
  uint uVar9;
  Qiniu_Retry_Decision QVar10;
  int iVar11;
  uint uVar12;
  Qiniu_Client *self;
  char *pcVar13;
  cJSON *object;
  cJSON *pcVar14;
  ulong uVar15;
  undefined8 uVar16;
  char *pcVar17;
  Qiniu_Reader QVar18;
  Qiniu_Error QVar19;
  Qiniu_ReaderAt r;
  Qiniu_ReaderAt r_00;
  Qiniu_Rio_BlkputRet ret;
  Qiniu_Crc32 crc32;
  Qiniu_Writer h;
  Qiniu_Section section;
  Qiniu_Tee tee;
  long local_180;
  int local_174;
  Qiniu_Rio_BlkputRet local_158;
  long *local_128;
  ulong local_120;
  Qiniu_Crc32 local_118;
  uint local_10c;
  undefined8 local_108;
  long local_100;
  size_t local_f8;
  long local_f0;
  Qiniu_FnReadAt local_e8;
  void *local_e0;
  long *local_d8;
  long local_d0;
  long *local_c8;
  void *local_c0;
  _Qiniu_Progress_Callback_Data_conflict local_b8;
  Qiniu_Writer local_90;
  Qiniu_Section local_78;
  Qiniu_Tee local_58;
  
  uVar16 = *(undefined8 *)((long)params + 0x20);
  local_d0 = *(long *)((long)params + 0x28);
  lVar4 = *(long *)((long)params + 0x18);
  plVar5 = *(long **)((long)params + 0x30);
  self = (Qiniu_Client *)
         (**(code **)(*(long *)(lVar4 + 0x40) + 8))
                   (*(undefined8 *)(lVar4 + 0x38),*(undefined8 *)((long)params + 0x10));
  if (**(long **)((long)params + 0x40) < 1) {
    blkIdx = *(uint *)((long)params + 0x48);
    local_174 = *(int *)(lVar4 + 0xc);
    local_158.host = (char *)0x0;
    local_158.economical = 0;
    local_158._44_4_ = 0;
    local_158.crc32 = 0;
    local_158.offset = 0;
    local_158.expiredAt = 0;
    local_158.ctx = (char *)0x0;
    local_158.checksum = (char *)0x0;
    local_c8 = (long *)(lVar4 + 0x78);
    local_f0 = (long)(int)blkIdx << 0x16;
    local_100 = (long)(int)blkIdx * 0x30;
    local_180 = 0;
    local_108 = uVar16;
    local_d8 = plVar5;
    do {
      Qiniu_Rio_BlkputRet_Assign
                (&local_158,(Qiniu_Rio_BlkputRet *)(*(long *)(lVar4 + 0x28) + local_100));
      pcVar13 = Qiniu_OK.message;
      uVar12 = Qiniu_OK.code;
      uVar2 = *(uint *)((long)params + 0x4c);
      iVar11 = *(int *)((long)params + 0x50);
      progress = *(_Qiniu_Uploading_Parts_Progress **)((long)params + 0x58);
      local_e0 = *params;
      local_e8 = *(Qiniu_FnReadAt *)((long)params + 8);
      Qiniu_Crc32Writer(&local_90,&local_118,0);
      uVar3 = *(uint *)(lVar4 + 8);
      local_b8._16_8_ = 0;
      local_b8.progress = (_Qiniu_Uploading_Parts_Progress *)0x0;
      local_b8.totalSize = 0;
      local_b8.previousUlNow = 0;
      local_b8.callback = (_func_void_size_t_size_t *)0x0;
      p_Var6 = *(_func_void_size_t_size_t **)(lVar4 + 0x90);
      if (p_Var6 != (_func_void_size_t_size_t *)0x0) {
        local_b8._20_4_ = 0;
        local_b8.blkIdx = blkIdx;
        local_b8.totalSize = (long)iVar11;
        local_b8.progress = progress;
        local_b8.callback = p_Var6;
      }
      local_120 = 1;
      local_128 = local_c8;
      if (*local_c8 == 0) {
        local_128 = *(long **)(lVar4 + 0x80);
        local_120 = *(ulong *)(lVar4 + 0x88);
      }
      if (local_158.ctx == (char *)0x0) {
        local_10c = uVar2;
        if ((int)uVar3 < (int)uVar2) {
          local_10c = uVar3;
        }
        iVar11 = 2;
        if (0 < *(int *)(lVar4 + 0xc)) {
          local_f8 = (size_t)(int)local_10c;
          uVar15 = 0xffffffffffffffff;
          while( true ) {
            sVar8 = local_f8;
            uVar1 = uVar15 + 1;
            r_00.ReadAt = local_e8;
            r_00.self = local_e0;
            QVar18 = Qiniu_SectionReader(&local_78,r_00,local_f0,local_f8);
            w_00.Write = local_90.Write;
            w_00.self = local_90.self;
            w_00.Flush = local_90.Flush;
            QVar18 = Qiniu_TeeReader(&local_58,QVar18,w_00);
            local_c0 = QVar18.self;
            pcVar17 = Qiniu_String_Format(0x80,"%s/mkblk/%d",local_128[uVar1 % local_120],
                                          (ulong)uVar2);
            QVar18.Read = QVar18.Read;
            QVar18.self = local_c0;
            QVar19 = Qiniu_Rio_bput(self,&local_158,QVar18,(int)sVar8,pcVar17,&local_b8);
            pcVar13 = QVar19.message;
            uVar12 = QVar19.code;
            Qiniu_Free(pcVar17);
            if (uVar12 == 200) break;
            if (*(long *)(lVar4 + 0x90) != 0) {
              _Qiniu_Uploading_Parts_Progress_Set_Progress(progress,blkIdx,0);
            }
            QVar10 = _Qiniu_Should_Retry(uVar12);
            if (QVar10 == QINIU_DONT_RETRY) {
              iVar11 = 5;
              goto LAB_00118510;
            }
            iVar11 = 2;
            if (((long)*(int *)(lVar4 + 0xc) <= (long)(uVar15 + 2)) ||
               (uVar15 = uVar1, self->hostsRetriesMax <= uVar1)) goto LAB_00118510;
          }
          uVar12 = 200;
          if (*(long *)(lVar4 + 0x90) != 0) {
            _Qiniu_Uploading_Parts_Progress_Part_Uploaded(progress,blkIdx,local_f8);
          }
          iVar11 = 2;
        }
LAB_00118510:
        pcVar17 = pcVar13;
        uVar9 = uVar12;
        if (iVar11 == 5) {
LAB_0011859d:
          local_180 = 0;
        }
        else if (iVar11 == 2) {
          if (uVar12 != 200) goto LAB_0011859d;
          local_180 = 1;
          uVar9 = 0x26ac;
          if (local_118.val == (local_158._16_8_ & 0xffffffff)) {
            pcVar17 = "unmatched checksum";
            if (local_158.offset == local_10c) {
              iVar11 = (**(code **)(lVar4 + 0x18))
                                 (*(undefined8 *)(lVar4 + 0x10),blkIdx,uVar2,&local_158);
              uVar12 = 200;
              local_180 = 1;
              pcVar17 = "Interrupted by the caller";
              uVar9 = 0x26af;
              if (iVar11 != 1) goto LAB_001180f8;
            }
          }
          else {
            pcVar17 = "unmatched checksum";
          }
        }
      }
      else {
        if (p_Var6 != (_func_void_size_t_size_t *)0x0) {
          _Qiniu_Uploading_Parts_Progress_Part_Uploaded
                    (progress,blkIdx,(ulong)local_158._16_8_ >> 0x20);
        }
        local_180 = 0;
LAB_001180f8:
        pcVar17 = pcVar13;
        uVar9 = uVar12;
        if ((int)local_158.offset < (int)uVar2) {
LAB_00118106:
          uVar12 = uVar2 - local_158.offset;
          if ((int)uVar3 < (int)(uVar2 - local_158.offset)) {
            uVar12 = uVar3;
          }
          uVar15 = self->hostsRetriesMax + 1;
          iVar11 = (int)uVar15;
          if ((ulong)(long)*(int *)(lVar4 + 0xc) <= uVar15) {
            iVar11 = *(int *)(lVar4 + 0xc);
          }
          uVar15 = (ulong)iVar11;
          do {
            local_118.val = 0;
            r.ReadAt = local_e8;
            r.self = local_e0;
            QVar18 = Qiniu_SectionReader(&local_78,r,((ulong)local_158._16_8_ >> 0x20) + local_f0,
                                         (long)(int)uVar12);
            w.Write = local_90.Write;
            w.self = local_90.self;
            w.Flush = local_90.Flush;
            QVar18 = Qiniu_TeeReader(&local_58,QVar18,w);
            pcVar13 = Qiniu_String_Format(0x400,"%s/bput/%s/%d",local_128[uVar15 % local_120],
                                          local_158.ctx,(ulong)local_158._16_8_ >> 0x20);
            QVar19 = Qiniu_Rio_bput(self,&local_158,QVar18,uVar12,pcVar13,&local_b8);
            pcVar17 = QVar19.message;
            uVar9 = QVar19.code;
            Qiniu_Free(pcVar13);
            if (uVar9 == 200) {
              local_180 = local_180 + 1;
              if (local_118.val == (local_158._16_8_ & 0xffffffff)) goto LAB_001182d5;
              Qiniu_Stderr_Warn("ResumableBlockput: invalid checksum, retry");
              uVar9 = 0x26ac;
              lVar7 = *(long *)(lVar4 + 0x90);
              pcVar17 = "unmatched checksum";
            }
            else {
              if (uVar9 == 0x2bd) {
                Qiniu_Rio_BlkputRet_Cleanup(&local_158);
                Qiniu_Stderr_Warn("ResumableBlockput: invalid ctx, please retry");
                uVar9 = 0x2bd;
                break;
              }
              Qiniu_Stderr_Warn("ResumableBlockput %d off:%d failed - %E",(ulong)blkIdx,
                                (ulong)local_158._16_8_ >> 0x20,(ulong)uVar9,pcVar17);
              lVar7 = *(long *)(lVar4 + 0x90);
            }
            if (lVar7 != 0) {
              _Qiniu_Uploading_Parts_Progress_Set_Progress(progress,blkIdx,0);
            }
            if (((long)uVar15 < 2) ||
               (QVar10 = _Qiniu_Should_Retry(uVar9), QVar10 == QINIU_DONT_RETRY)) break;
            uVar15 = uVar15 - 1;
            Qiniu_Stderr_Info("ResumableBlockput %E, retrying ...",(ulong)uVar9,pcVar17);
          } while( true );
        }
      }
LAB_001185a9:
      if (uVar9 == 200) {
        Qiniu_Rio_BlkputRet_Assign
                  ((Qiniu_Rio_BlkputRet *)(local_100 + *(long *)(lVar4 + 0x28)),&local_158);
        if ((local_d8 != (long *)0x0 && local_180 != 0) && (lVar4 = *local_d8, lVar4 != 0)) {
          object = cJSON_CreateObject();
          pcVar14 = cJSON_CreateNumber((double)(int)blkIdx);
          cJSON_AddItemToObject(object,"blkIdx",pcVar14);
          pcVar14 = cJSON_CreateString(local_158.ctx);
          cJSON_AddItemToObject(object,"ctx",pcVar14);
          pcVar14 = cJSON_CreateString(local_158.checksum);
          cJSON_AddItemToObject(object,"checksum",pcVar14);
          pcVar14 = cJSON_CreateNumber((double)(local_158._16_8_ & 0xffffffff));
          cJSON_AddItemToObject(object,"crc32",pcVar14);
          pcVar14 = cJSON_CreateNumber((double)((ulong)local_158._16_8_ >> 0x20));
          cJSON_AddItemToObject(object,"offset",pcVar14);
          pcVar14 = cJSON_CreateNumber(((double)CONCAT44(0x45300000,
                                                         (int)(local_158.expiredAt >> 0x20)) -
                                       1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)local_158.expiredAt) -
                                       4503599627370496.0));
          cJSON_AddItemToObject(object,"expiredAt",pcVar14);
          pcVar14 = cJSON_CreateString(local_158.host);
          cJSON_AddItemToObject(object,"host",pcVar14);
          pcVar13 = cJSON_PrintUnformatted(object);
          cJSON_Delete(object);
          if (pcVar13 != (char *)0x0) {
            (**(code **)(lVar4 + 0x10))(lVar4,pcVar13,0);
            free(pcVar13);
          }
        }
        goto LAB_001187d1;
      }
      if (uVar9 == 0x26af) {
        Qiniu_Rio_BlkputRet_Cleanup(&local_158);
        Qiniu_Count_Inc(*(Qiniu_Count **)((long)params + 0x40));
        goto LAB_001187e0;
      }
      if ((local_174 < 2) || (QVar10 = _Qiniu_Should_Retry(uVar9), QVar10 == QINIU_DONT_RETRY))
      goto LAB_00118612;
      local_174 = local_174 + -1;
      Qiniu_Stderr_Info("resumable.Put %E, retrying ...",(ulong)uVar9,pcVar17);
    } while( true );
  }
  free(params);
  Qiniu_Count_Inc(*(Qiniu_Count **)((long)params + 0x40));
LAB_001187ed:
  (**(code **)(local_d0 + 8))(uVar16);
  return;
LAB_001182d5:
  iVar11 = (**(code **)(lVar4 + 0x18))(*(undefined8 *)(lVar4 + 0x10),blkIdx,uVar2,&local_158);
  if (iVar11 == 1) {
    pcVar17 = "Interrupted by the caller";
    uVar9 = 0x26af;
    goto LAB_001185a9;
  }
  if (*(long *)(lVar4 + 0x90) != 0) {
    _Qiniu_Uploading_Parts_Progress_Part_Uploaded(progress,blkIdx,(long)(int)uVar12);
  }
  uVar9 = 200;
  if ((int)uVar2 <= (int)local_158.offset) goto LAB_001185a9;
  goto LAB_00118106;
LAB_00118612:
  Qiniu_Stderr_Warn("resumable.Put %d failed: %E",(ulong)blkIdx,(ulong)uVar9,pcVar17);
  (**(code **)(lVar4 + 0x20))
            (*(undefined8 *)(lVar4 + 0x10),*(undefined4 *)((long)params + 0x48),
             *(undefined4 *)((long)params + 0x4c),uVar9,pcVar17);
  **(int **)((long)params + 0x38) = **(int **)((long)params + 0x38) + 1;
LAB_001187d1:
  Qiniu_Rio_BlkputRet_Cleanup(&local_158);
LAB_001187e0:
  free(params);
  uVar16 = local_108;
  goto LAB_001187ed;
}

Assistant:

static void Qiniu_Rio_doTask(void *params)
{
    Qiniu_Rio_BlkputRet ret;
    Qiniu_Rio_task *task = (Qiniu_Rio_task *)params;
    Qiniu_Rio_WaitGroup wg = task->wg;
    Qiniu_Rio_PutExtra *extra = task->extra;
    Qiniu_Rio_Recorder *recorder = task->recorder;
    Qiniu_Rio_ThreadModel tm = extra->threadModel;
    Qiniu_Client *c = tm.itbl->ClientTls(tm.self, task->mc);
    int blkIdx = task->blkIdx;
    int tryTimes = extra->tryTimes;
    size_t chunksUploaded = 0;

    if ((*task->ninterrupts) > 0)
    {
        free(task);
        Qiniu_Count_Inc(task->ninterrupts);
        wg.itbl->Done(wg.self);
        return;
    }

    memset(&ret, 0, sizeof(ret));

lzRetry:
    Qiniu_Rio_BlkputRet_Assign(&ret, &extra->progresses[blkIdx]);
    Qiniu_Error err = Qiniu_Rio_ResumableBlockput(c, &ret, task->f, blkIdx, task->blkSize1, task->fsize, task->progress, extra, &chunksUploaded);
    if (err.code != 200)
    {
        if (err.code == Qiniu_Rio_PutInterrupted)
        {
            // Terminate the upload process if the caller requests
            Qiniu_Rio_BlkputRet_Cleanup(&ret);
            Qiniu_Count_Inc(task->ninterrupts);
            free(task);
            wg.itbl->Done(wg.self);
            return;
        }

        if (tryTimes > 1 && _Qiniu_Should_Retry(err.code) != QINIU_DONT_RETRY)
        {
            tryTimes--;
            Qiniu_Log_Info("resumable.Put %E, retrying ...", err);
            goto lzRetry;
        }
        Qiniu_Log_Warn("resumable.Put %d failed: %E", blkIdx, err);
        extra->notifyErr(extra->notifyRecvr, task->blkIdx, task->blkSize1, err);
        (*task->nfails)++;
    }
    else
    {
        Qiniu_Rio_BlkputRet_Assign(&extra->progresses[blkIdx], &ret);
        if (chunksUploaded > 0 && recorder != NULL && recorder->recorderMedium != NULL)
        {
            Qiniu_Rio_Recorder_Write_Medium(recorder->recorderMedium, blkIdx, &ret);
        }
    }
    Qiniu_Rio_BlkputRet_Cleanup(&ret);
    free(task);
    wg.itbl->Done(wg.self);
}